

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

sxi32 jx9NewForeignFunction
                (jx9_vm *pVm,SyString *pName,ProcHostFunction xFunc,void *pUserData,
                jx9_user_func **ppOut)

{
  jx9_user_func *pSrc;
  char *pcVar1;
  char *zDup;
  jx9_user_func *pFunc;
  jx9_user_func **ppOut_local;
  void *pUserData_local;
  ProcHostFunction xFunc_local;
  SyString *pName_local;
  jx9_vm *pVm_local;
  
  pSrc = (jx9_user_func *)SyMemBackendPoolAlloc(&pVm->sAllocator,0x50);
  if (pSrc == (jx9_user_func *)0x0) {
    pVm_local._4_4_ = -1;
  }
  else {
    pcVar1 = SyMemBackendStrDup(&pVm->sAllocator,pName->zString,pName->nByte);
    if (pcVar1 == (char *)0x0) {
      SyMemBackendPoolFree(&pVm->sAllocator,pSrc);
      pVm_local._4_4_ = -1;
    }
    else {
      SyZero(pSrc,0x50);
      (pSrc->sName).zString = pcVar1;
      (pSrc->sName).nByte = pName->nByte;
      pSrc->pVm = pVm;
      pSrc->xFunc = xFunc;
      pSrc->pUserData = pUserData;
      SySetInit(&pSrc->aAux,&pVm->sAllocator,8);
      *ppOut = pSrc;
      pVm_local._4_4_ = 0;
    }
  }
  return pVm_local._4_4_;
}

Assistant:

static sxi32 jx9NewForeignFunction(
	jx9_vm *pVm,              /* Target VM */
	const SyString *pName,    /* Foreign function name */
	ProcHostFunction xFunc,  /* Foreign function implementation */
	void *pUserData,          /* Foreign function private data */
	jx9_user_func **ppOut     /* OUT: VM image of the foreign function */
	)
{
	jx9_user_func *pFunc;
	char *zDup;
	/* Allocate a new user function */
	pFunc = (jx9_user_func *)SyMemBackendPoolAlloc(&pVm->sAllocator, sizeof(jx9_user_func));
	if( pFunc == 0 ){
		return SXERR_MEM;
	}
	/* Duplicate function name */
	zDup = SyMemBackendStrDup(&pVm->sAllocator, pName->zString, pName->nByte);
	if( zDup == 0 ){
		SyMemBackendPoolFree(&pVm->sAllocator, pFunc);
		return SXERR_MEM;
	}
	/* Zero the structure */
	SyZero(pFunc, sizeof(jx9_user_func));
	/* Initialize structure fields */
	SyStringInitFromBuf(&pFunc->sName, zDup, pName->nByte);
	pFunc->pVm   = pVm;
	pFunc->xFunc = xFunc;
	pFunc->pUserData = pUserData;
	SySetInit(&pFunc->aAux, &pVm->sAllocator, sizeof(jx9_aux_data));
	/* Write a pointer to the new function */
	*ppOut = pFunc;
	return SXRET_OK;
}